

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kseq.hpp
# Opt level: O1

int __thiscall
kstream<gzFile_s_*,_FunctorZlib>::readFastq(kstream<gzFile_s_*,_FunctorZlib> *this,kseq *seq)

{
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  FILE *__stream;
  char *pcVar5;
  
  (seq->comment)._M_string_length = 0;
  *(seq->comment)._M_dataplus._M_p = '\0';
  (seq->seq)._M_string_length = 0;
  *(seq->seq)._M_dataplus._M_p = '\0';
  (seq->qual)._M_string_length = 0;
  *(seq->qual)._M_dataplus._M_p = '\0';
  if (this->c == 10) {
    iVar1 = getName(this,seq);
    if (iVar1 == -1) {
      uVar3 = 0xfffffffe;
      if (this->is_eof == 1) goto LAB_001966b2;
      pcVar5 = "ERROR: Unexpected ID after ";
      lVar4 = 0x1b;
    }
    else if (this->c == 10) {
      __stream = (FILE *)seq;
      getSeq(this,seq);
      if (this->c != 0x2b) {
        uVar3 = (ulong)(uint)(seq->seq)._M_string_length;
        goto LAB_001966b2;
      }
      do {
        iVar1 = getc(this,__stream);
        this->c = iVar1;
        if (iVar1 == 10) {
          getQual(this,seq);
          if (this->c != 10) {
            pcVar5 = "ERROR: The quality string appears to be longer for ID ";
            lVar4 = 0x36;
            goto LAB_0019666c;
          }
          uVar3 = (seq->seq)._M_string_length;
          if (uVar3 == (seq->qual)._M_string_length) goto LAB_001966b2;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "ERROR: The length of the sequence doesn\'t match the quality for ID ",0x43);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(seq->name)._M_dataplus._M_p,
                              (seq->name)._M_string_length);
          std::endl<char,std::char_traits<char>>(poVar2);
          goto LAB_001966ad;
        }
      } while (iVar1 != -1);
      pcVar5 = "ERROR: File ended unexpectedly on ID ";
      lVar4 = 0x25;
    }
    else {
      pcVar5 = "ERROR: There must have been a problem reading the ID of ";
      lVar4 = 0x38;
    }
  }
  else {
    pcVar5 = "ERROR: Unexpected record start, last valid record: ";
    lVar4 = 0x33;
  }
LAB_0019666c:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(seq->name)._M_dataplus._M_p,
                      (seq->name)._M_string_length);
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
LAB_001966ad:
  uVar3 = 0xfffffffd;
LAB_001966b2:
  return (int)uVar3;
}

Assistant:

int readFastq(kseq& seq) {
        seq.comment.clear();
        seq.seq.clear();
        seq.qual.clear();

        if (c != '\n') {
            std::cerr << "ERROR: Unexpected record start, last valid record: " << seq.name << std::endl;
            return -3;
        }

        if (getName(seq) == -1) {
            if (is_eof != 1) {
                std::cerr << "ERROR: Unexpected ID after " << seq.name << std::endl;
                return -3;
            } else {
                return -2;
            }
        }

        bool good(false);
        switch(c){
            case 10:    // new line character
                good = true;
                break;
        }
        if (!good) {
            std::cerr << "ERROR: There must have been a problem reading the ID of " << seq.name << std::endl;
            return -3;
        }

        getSeq(seq);
        if (c != '+') {
            return (int)seq.seq.length();
        }
        while ((c = this->getc()) != -1 && c != '\n');  // Ignore whatever comes after '+'

        if (c == -1) {
            std::cerr << "ERROR: File ended unexpectedly on ID " << seq.name << std::endl;
            return -3; // File ended unexpectedly
        }

        getQual(seq);
        if (c != '\n') {
            std::cerr << "ERROR: The quality string appears to be longer for ID " << seq.name << std::endl;
            return -3;
        }
        if (seq.seq.length() != seq.qual.length()) {
            std::cerr << "ERROR: The length of the sequence doesn't match the quality for ID " << seq.name << std::endl;
            return -3;
        }
        return (int)seq.seq.length();
    }